

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

size_t gz_read(gz_state *state,void *buf,size_t len)

{
  uchar **ppuVar1;
  off64_t *poVar2;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  uint len_00;
  size_t sVar6;
  undefined8 uStack_38;
  
  if (len == 0) {
    return 0;
  }
  uStack_38 = in_RAX;
  if (state->seek != 0) {
    state->seek = 0;
    iVar4 = gz_skip(state,state->skip);
    if (iVar4 == -1) {
      return 0;
    }
  }
  sVar6 = 0;
  do {
    uVar5 = 0xffffffff;
    if (len < 0xffffffff) {
      uVar5 = len;
    }
    len_00 = (uint)uVar5;
    uStack_38 = CONCAT44(len_00,(undefined4)uStack_38);
    uVar3 = (state->x).have;
    if (uVar3 == 0) {
      if ((state->eof != 0) && ((state->strm).avail_in == 0)) {
        state->past = 1;
        return sVar6;
      }
      if ((state->how != 0) && (state->size * 2 <= len_00)) {
        if (state->how == 1) {
          iVar4 = gz_load(state,(uchar *)buf,len_00,(uint *)((long)&uStack_38 + 4));
          if (iVar4 == -1) {
            return 0;
          }
          uVar5 = uStack_38 >> 0x20;
        }
        else {
          (state->strm).avail_out = len_00;
          (state->strm).next_out = (uint8_t *)buf;
          iVar4 = gz_decomp(state);
          if (iVar4 == -1) {
            return 0;
          }
          uVar5 = (ulong)(state->x).have;
          uStack_38 = uStack_38 & 0xffffffff;
          (state->x).have = 0;
        }
        goto LAB_001031d1;
      }
      iVar4 = gz_fetch(state);
      if (iVar4 == -1) {
        return 0;
      }
    }
    else {
      if (uVar3 < len_00) {
        uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
        uVar5 = (ulong)uVar3;
      }
      memcpy(buf,(state->x).next,uVar5 & 0xffffffff);
      ppuVar1 = &(state->x).next;
      *ppuVar1 = *ppuVar1 + (uVar5 & 0xffffffff);
      (state->x).have = (state->x).have - (int)uVar5;
LAB_001031d1:
      uVar5 = uVar5 & 0xffffffff;
      len = len - uVar5;
      buf = (void *)((long)buf + uVar5);
      sVar6 = sVar6 + uVar5;
      poVar2 = &(state->x).pos;
      *poVar2 = *poVar2 + uVar5;
    }
    if (len == 0) {
      return sVar6;
    }
  } while( true );
}

Assistant:

static size_t gz_read(gz_state *state, void *buf, size_t len) {
    size_t got;
    unsigned n;

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return 0;
    }

    /* get len bytes to buf, or less than len if at the end */
    got = 0;
    do {
        /* set n to the maximum amount of len that fits in an unsigned int */
        n = (unsigned)-1;
        if (n > len)
            n = (unsigned)len;

        /* first just try copying data from the output buffer */
        if (state->x.have) {
            if (state->x.have < n)
                n = state->x.have;
            memcpy(buf, state->x.next, n);
            state->x.next += n;
            state->x.have -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0) {
            state->past = 1;        /* tried to read past end */
            break;
        }

        /* need output data -- for small len or new stream load up our output
           buffer */
        else if (state->how == LOOK || n < (state->size << 1)) {
            /* get more output, looking for header if required */
            if (gz_fetch(state) == -1)
                return 0;
            continue;       /* no progress yet -- go back to copy above */
            /* the copy above assures that we will leave with space in the
               output buffer, allowing at least one gzungetc() to succeed */
        }

        /* large len -- read directly into user buffer */
        else if (state->how == COPY) {      /* read directly */
            if (gz_load(state, (unsigned char *)buf, n, &n) == -1)
                return 0;
        }

        /* large len -- decompress directly into user buffer */
        else {  /* state->how == GZIP */
            state->strm.avail_out = n;
            state->strm.next_out = (unsigned char *)buf;
            if (gz_decomp(state) == -1)
                return 0;
            n = state->x.have;
            state->x.have = 0;
        }

        /* update progress */
        len -= n;
        buf = (char *)buf + n;
        got += n;
        state->x.pos += n;
    } while (len);

    /* return number of bytes read into user buffer */
    return got;
}